

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_119f01::BIOTest_Printf_Test::TestBody(BIOTest_Printf_Test *this)

{
  int iVar1;
  BIO_METHOD *type;
  pointer *__ptr;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  pointer pcVar3;
  char *in_R9;
  ScopedTrace gtest_trace_346;
  string in;
  UniquePtr<BIO> bio;
  int ret;
  size_t length;
  size_t len;
  uint8_t *contents;
  ScopedTrace local_c1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  AssertHelper local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Head_base<0UL,_bio_st_*,_false> local_58;
  int local_4c;
  unsigned_long local_48;
  AssertHelperData *local_40;
  uint8_t *local_38;
  
  type = BIO_s_mem();
  local_58._M_head_impl = (bio_st *)BIO_new(type);
  local_b0[0] = (internal)((BIO *)local_58._M_head_impl != (BIO *)0x0);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((BIO *)local_58._M_head_impl == (BIO *)0x0) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_b0,(AssertionResult *)0x596543,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
               ,0x157,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
  }
  else {
    lVar2 = 0;
    do {
      local_48 = *(unsigned_long *)((long)TestBody::kLengths + lVar2);
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                (&local_c1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                 ,0x15a,&local_48);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_78,(char)local_48);
      local_4c = BIO_printf((BIO *)local_58._M_head_impl,"test %s",local_78._M_dataplus._M_p);
      local_c0._M_head_impl = local_c0._M_head_impl & 0xffffffff00000000;
      testing::internal::CmpHelperGE<int,int>
                ((internal *)local_b0,"ret","0",&local_4c,(int *)&local_c0);
      if (local_b0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_c0);
        if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (local_a8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                   ,0x15f,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
        if (local_c0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_c0._M_head_impl + 8))();
        }
        if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a8;
          __ptr_00 = local_a8;
LAB_001fa3b0:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(this_00,__ptr_00);
        }
LAB_001fa3b5:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        testing::ScopedTrace::~ScopedTrace(&local_c1);
        break;
      }
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,local_a8);
      }
      local_c0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_48 + 5)
      ;
      local_90._M_len = (size_t)local_4c;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_b0,"5 + length","static_cast<size_t>(ret)",
                 (unsigned_long *)&local_c0,&local_90._M_len);
      if (local_b0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_c0);
        message = "";
        if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = (local_a8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                   ,0x160,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
        if (local_c0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_c0._M_head_impl + 8))();
        }
      }
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a8,local_a8);
      }
      iVar1 = BIO_mem_contents(local_58._M_head_impl,&local_38,(size_t *)&local_40);
      local_c0._M_head_impl._0_1_ = (internal)(iVar1 != 0);
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_b0,(internal *)&local_c0,
                   (AssertionResult *)"BIO_mem_contents(bio.get(), &contents, &len)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                   ,0x164,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
LAB_001fa30f:
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1
                         );
        }
        if ((AssertHelperData *)local_90._M_len != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_90._M_len + 8))();
        }
        if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_b8;
          __ptr_00 = local_b8;
          goto LAB_001fa3b0;
        }
        goto LAB_001fa3b5;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     "test ",&local_78);
      local_90._M_len = (size_t)local_40;
      local_90._M_str = (char *)local_38;
      testing::internal::
      CmpHelperEQ<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                ((internal *)&local_c0,"\"test \" + in",
                 "bssl::BytesAsStringView(bssl::Span(contents, len))",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 &local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
      }
      if (local_c0._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)local_b0);
        pcVar3 = "";
        if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = (local_b8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                   ,0x165,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_b0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
        if ((long *)CONCAT71(local_b0._1_7_,local_b0[0]) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_b0._1_7_,local_b0[0]) + 8))();
        }
      }
      if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8,local_b8);
      }
      iVar1 = BIO_reset(local_58._M_head_impl);
      local_c0._M_head_impl._0_1_ = (internal)(iVar1 != 0);
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_b0,(internal *)&local_c0,
                   (AssertionResult *)"BIO_reset(bio.get())","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_test.cc"
                   ,0x167,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
        goto LAB_001fa30f;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      testing::ScopedTrace::~ScopedTrace(&local_c1);
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x38);
  }
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_58);
  return;
}

Assistant:

TEST(BIOTest, Printf) {
  // Test a short output, a very long one, and various sizes around
  // 256 (the size of the buffer) to ensure edge cases are correct.
  static const size_t kLengths[] = {5, 250, 251, 252, 253, 254, 1023};

  bssl::UniquePtr<BIO> bio(BIO_new(BIO_s_mem()));
  ASSERT_TRUE(bio);

  for (size_t length : kLengths) {
    SCOPED_TRACE(length);

    std::string in(length, 'a');

    int ret = BIO_printf(bio.get(), "test %s", in.c_str());
    ASSERT_GE(ret, 0);
    EXPECT_EQ(5 + length, static_cast<size_t>(ret));

    const uint8_t *contents;
    size_t len;
    ASSERT_TRUE(BIO_mem_contents(bio.get(), &contents, &len));
    EXPECT_EQ("test " + in, bssl::BytesAsStringView(bssl::Span(contents, len)));

    ASSERT_TRUE(BIO_reset(bio.get()));
  }
}